

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O3

void __thiscall
leveldb::log::LogTest::CheckOffsetPastEndReturnsNoRecords(LogTest *this,uint64_t offset_past_end)

{
  size_type sVar1;
  bool bVar2;
  Reader *this_00;
  Slice record;
  string scratch;
  Slice local_1f8;
  string local_1e8;
  Tester local_1c8;
  
  WriteInitialOffsetLog(this);
  this->reading_ = true;
  sVar1 = (this->dest_).contents_._M_string_length;
  (this->source_).contents_.data_ = (this->dest_).contents_._M_dataplus._M_p;
  (this->source_).contents_.size_ = sVar1;
  this_00 = (Reader *)operator_new(0x58);
  Reader::Reader(this_00,&(this->source_).super_SequentialFile,&(this->report_).super_Reporter,true,
                 offset_past_end + sVar1);
  local_1f8.data_ = "";
  local_1f8.size_ = 0;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc";
  local_1c8.line_ = 0x85;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  bVar2 = Reader::ReadRecord(this_00,&local_1f8,&local_1e8);
  test::Tester::Is(&local_1c8,!bVar2,"!offset_reader->ReadRecord(&record, &scratch)");
  test::Tester::~Tester(&local_1c8);
  Reader::~Reader(this_00);
  operator_delete(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CheckOffsetPastEndReturnsNoRecords(uint64_t offset_past_end) {
    WriteInitialOffsetLog();
    reading_ = true;
    source_.contents_ = Slice(dest_.contents_);
    Reader* offset_reader = new Reader(&source_, &report_, true /*checksum*/,
                                       WrittenBytes() + offset_past_end);
    Slice record;
    std::string scratch;
    ASSERT_TRUE(!offset_reader->ReadRecord(&record, &scratch));
    delete offset_reader;
  }